

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

CScript * GetScriptForMultisig
                    (CScript *__return_storage_ptr__,int nRequired,
                    vector<CPubKey,_std::allocator<CPubKey>_> *keys)

{
  pointer pCVar1;
  CScript *this;
  pointer in;
  long in_FS_OFFSET;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x10) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x18) = 0;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = 0;
  CScript::push_int64(__return_storage_ptr__,(long)nRequired);
  pCVar1 = (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (in = (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
            super__Vector_impl_data._M_start; in != pCVar1; in = in + 1) {
    ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_48,in);
    CScript::operator<<(__return_storage_ptr__,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_48);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_48);
  }
  this = CScript::push_int64(__return_storage_ptr__,
                             ((long)(keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>).
                                   _M_impl.super__Vector_impl_data._M_start) / 0x41);
  CScript::operator<<(this,OP_CHECKMULTISIG);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CScript GetScriptForMultisig(int nRequired, const std::vector<CPubKey>& keys)
{
    CScript script;

    script << nRequired;
    for (const CPubKey& key : keys)
        script << ToByteVector(key);
    script << keys.size() << OP_CHECKMULTISIG;

    return script;
}